

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

void nni_aio_reset(nni_aio *aio)

{
  uint i;
  long lVar1;
  
  aio->a_result = NNG_OK;
  aio->a_count = 0;
  aio->a_abort = false;
  aio->a_sleep = false;
  aio->a_expire_ok = false;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    aio->a_outputs[lVar1] = (void *)0x0;
  }
  return;
}

Assistant:

void
nni_aio_reset(nni_aio *aio)
{
	aio->a_result    = NNG_OK;
	aio->a_count     = 0;
	aio->a_abort     = false;
	aio->a_expire_ok = false;
	aio->a_sleep     = false;

	for (unsigned i = 0; i < NNI_NUM_ELEMENTS(aio->a_outputs); i++) {
		aio->a_outputs[i] = NULL;
	}
}